

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void vk::BinaryRegistryDetail::anon_unknown_8::normalizeSparseIndex(SparseIndexNode *group)

{
  SparseIndexNode *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  value_type local_20;
  
  ppSVar2 = (group->children).
            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (group->children).
            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar3 == ppSVar2) {
    uVar7 = 0;
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    uVar8 = 0;
    do {
      normalizeSparseIndex(ppSVar2[uVar8]);
      ppSVar2 = (group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar2[uVar8]->word == 0) {
        uVar6 = uVar8 & 0xffffffff;
      }
      uVar8 = uVar8 + 1;
      uVar7 = (long)ppSVar3 - (long)ppSVar2 >> 3;
    } while (uVar8 < uVar7);
  }
  if ((int)uVar6 < 0) {
    if (ppSVar2 != ppSVar3) {
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::reserve(&group->children,uVar7 + 1);
      local_20 = (value_type)operator_new(0x20);
      local_20->word = 0;
      local_20->index = 0;
      (local_20->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_20->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_20->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::push_back(&group->children,&local_20);
    }
  }
  else {
    ppSVar2 = (group->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)uVar6 !=
        (int)((ulong)((long)(group->children).
                            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2) >> 3) + -1)
    {
      do {
        iVar4 = (int)uVar6;
        uVar5 = iVar4 + 1;
        uVar6 = (ulong)uVar5;
        pSVar1 = ppSVar2[iVar4];
        ppSVar2[iVar4] = ppSVar2[(int)uVar5];
        ppSVar2[(int)uVar5] = pSVar1;
        ppSVar2 = (group->children).
                  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (iVar4 != (int)((ulong)((long)(group->children).
                                            super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppSVar2) >> 3) + -2);
    }
  }
  return;
}

Assistant:

void normalizeSparseIndex (SparseIndexNode* group)
{
	int		zeroChildPos	= -1;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		normalizeSparseIndex(group->children[childNdx]);

		if (group->children[childNdx]->word == 0)
		{
			DE_ASSERT(zeroChildPos < 0);
			zeroChildPos = (int)childNdx;
		}
	}

	if (zeroChildPos >= 0)
	{
		// Move child with word = 0 to last
		while (zeroChildPos != (int)group->children.size()-1)
		{
			std::swap(group->children[zeroChildPos], group->children[zeroChildPos+1]);
			zeroChildPos += 1;
		}
	}
	else if (!group->children.empty())
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(0, 0));
	}
}